

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

undefined8 __thiscall
cnn::PickNegLogSoftmax::as_string
          (PickNegLogSoftmax *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  const_reference pvVar4;
  reference puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  uint v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  string sep;
  ostringstream s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1d8;
  undefined8 local_1d0;
  allocator local_1c1;
  string local_1c0 [48];
  ostringstream local_190 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (*(long *)(in_RSI + 0x60) == 0) {
    poVar3 = std::operator<<((ostream *)local_190,"log_softmax(");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    std::operator<<(poVar3,")_{");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"",&local_1c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    local_1d0 = *(undefined8 *)(in_RSI + 0x80);
    local_1d8._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (in_stack_fffffffffffffdb8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_fffffffffffffdb8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_fffffffffffffdc0,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_fffffffffffffdb8);
      if (!bVar2) break;
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_1d8);
      uVar1 = *puVar5;
      in_stack_fffffffffffffdc0 = std::operator<<((ostream *)local_190,local_1c0);
      std::ostream::operator<<(in_stack_fffffffffffffdc0,uVar1);
      std::__cxx11::string::operator=(local_1c0,",");
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_1d8);
    }
    std::operator<<((ostream *)local_190,'}');
    std::__cxx11::string::~string(local_1c0);
  }
  else {
    poVar3 = std::operator<<((ostream *)local_190,"log_softmax(");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    poVar3 = std::operator<<(poVar3,")_{");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,**(uint **)(in_RSI + 0x60));
    std::operator<<(poVar3,'}');
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

string PickNegLogSoftmax::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  if(pval) {
    s << "log_softmax(" << arg_names[0] << ")_{" << *pval << '}';
  } else {
    s << "log_softmax(" << arg_names[0] << ")_{";
    string sep = "";
    for(auto v : *pvals) { s << sep << v; sep = ","; }
    s << '}';
  }
  return s.str();
}